

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

char16_t *
jessilib::parse_decimal_part<char16_t,long_double>
          (char16_t *in_str,char16_t *in_str_end,longdouble *out_value)

{
  int local_2c;
  int denominator;
  longdouble *out_value_local;
  char16_t *in_str_end_local;
  char16_t *in_str_local;
  
  local_2c = 10;
  for (in_str_end_local = in_str;
      (in_str_end_local != in_str_end && ((ushort)*in_str_end_local - 0x30 < 10));
      in_str_end_local = in_str_end_local + 1) {
    if (*out_value < (longdouble)0) {
      *out_value = *out_value -
                   (longdouble)(int)((ushort)*in_str_end_local - 0x30) / (longdouble)local_2c;
    }
    else {
      *out_value = *out_value +
                   (longdouble)(int)((ushort)*in_str_end_local - 0x30) / (longdouble)local_2c;
    }
    local_2c = local_2c * 10;
  }
  return in_str_end_local;
}

Assistant:

const CharT* parse_decimal_part(const CharT* in_str, const CharT* in_str_end, NumberT& out_value) {
	int denominator = 10;
	while (in_str != in_str_end) {
		switch (*in_str) {
			case '0':
			case '1':
			case '2':
			case '3':
			case '4':
			case '5':
			case '6':
			case '7':
			case '8':
			case '9':
				if (out_value >= 0.0) {
					out_value += (static_cast<NumberT>(*in_str - '0') / denominator);
				}
				else {
					out_value -= (static_cast<NumberT>(*in_str - '0') / denominator);
				}
				denominator *= 10;
				break;

			default:
				return in_str;
		}

		++in_str;
	}

	return in_str;
}